

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O3

line_data_t * kiste::parse_line(line_data_t *__return_storage_ptr__,parse_context *ctx)

{
  string *line;
  pointer *ppcVar1;
  char cVar2;
  ulong uVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  undefined1 *puVar6;
  pointer pcVar7;
  bool bVar8;
  bool bVar9;
  initializer_list<kiste::segment_t> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rest;
  allocator_type local_e9;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  string local_a8;
  pointer *local_88;
  long local_80;
  pointer local_78 [2];
  pointer *local_68;
  long local_60;
  pointer local_58 [2];
  vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> local_48;
  
  line = &ctx->_line;
  uVar3 = std::__cxx11::string::find_first_not_of((char *)line,0x1090d6,0);
  if (uVar3 == 0xffffffffffffffff) {
    if ((ctx->_class_curly_level != 0) && (ctx->_class_curly_level < ctx->_curly_level)) {
      parse_text_line(__return_storage_ptr__,ctx,line);
      return __return_storage_ptr__;
    }
    memset(__return_storage_ptr__,0,0xa0);
    (__return_storage_ptr__->_class_data)._name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_class_data)._name.field_2;
    (__return_storage_ptr__->_class_data)._name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_class_data)._parent_name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_class_data)._parent_name.field_2;
    (__return_storage_ptr__->_class_data)._parent_name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_member).class_name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_member).class_name.field_2;
    (__return_storage_ptr__->_member).class_name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_member).name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_member).name.field_2;
    (__return_storage_ptr__->_member).name.field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  std::__cxx11::string::substr((ulong)&local_a8,(ulong)line);
  if ((ctx->_line)._M_string_length <= uVar3) {
    uVar5 = std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar3);
    if ((pointer *)local_e8._0_8_ != (pointer *)(uVar3 + 1)) {
      operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(uVar5);
  }
  cVar2 = (line->_M_dataplus)._M_p[uVar3];
  if (cVar2 == '$') {
    ppcVar1 = (pointer *)(local_e8 + 0x10);
    local_e8._0_8_ = ppcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"class","");
    if (local_a8._M_string_length < (ulong)local_e8._8_8_) {
      bVar8 = false;
    }
    else if ((pointer)local_e8._8_8_ == (pointer)0x0) {
      bVar8 = true;
    }
    else {
      puVar6 = (undefined1 *)0x0;
      do {
        bVar8 = *(char *)(local_e8._0_8_ + (long)puVar6) == local_a8._M_dataplus._M_p[(long)puVar6];
        if (!bVar8) break;
        bVar9 = (undefined1 *)((long)&(((pointer)(local_e8._8_8_ + -0x30))->_text).field_2 + 0xf) !=
                puVar6;
        puVar6 = puVar6 + 1;
      } while (bVar9);
    }
    if ((pointer *)local_e8._0_8_ != ppcVar1) {
      operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._M_allocated_capacity + 1));
    }
    if (bVar8) {
      parse_class((class_t *)local_e8,ctx,&local_a8);
      line_data_t::line_data_t(__return_storage_ptr__,(class_t *)local_e8);
LAB_0010554d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_allocated_capacity != &local_b8) {
        operator_delete((void *)local_c8._M_allocated_capacity,local_b8._M_allocated_capacity + 1);
      }
    }
    else {
      local_e8._0_8_ = ppcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"endclass","");
      if (local_a8._M_string_length < (ulong)local_e8._8_8_) {
        bVar8 = false;
      }
      else if ((pointer)local_e8._8_8_ == (pointer)0x0) {
        bVar8 = true;
      }
      else {
        puVar6 = (undefined1 *)0x0;
        do {
          bVar8 = *(char *)(local_e8._0_8_ + (long)puVar6) ==
                  local_a8._M_dataplus._M_p[(long)puVar6];
          if (!bVar8) break;
          bVar9 = (undefined1 *)((long)&(((pointer)(local_e8._8_8_ + -0x30))->_text).field_2 + 0xf)
                  != puVar6;
          puVar6 = puVar6 + 1;
        } while (bVar9);
      }
      if ((pointer *)local_e8._0_8_ != ppcVar1) {
        operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._M_allocated_capacity + 1));
      }
      if (bVar8) {
        local_e8._0_8_ = (pointer *)0x0;
        local_e8._8_8_ = (pointer)0x0;
        local_d8._M_allocated_capacity = 0;
        __return_storage_ptr__->_type = class_end;
        std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::vector
                  (&__return_storage_ptr__->_segments,
                   (vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *)local_e8);
        (__return_storage_ptr__->_class_data)._name._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->_class_data)._name.field_2;
        (__return_storage_ptr__->_class_data)._name._M_string_length = 0;
        (__return_storage_ptr__->_class_data)._name.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->_class_data)._parent_name._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->_class_data)._parent_name.field_2;
        (__return_storage_ptr__->_class_data)._parent_name._M_string_length = 0;
        (__return_storage_ptr__->_class_data)._parent_name.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->_member).class_name._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->_member).class_name.field_2;
        (__return_storage_ptr__->_member).class_name._M_string_length = 0;
        (__return_storage_ptr__->_member).class_name.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->_member).name._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->_member).name.field_2;
        (__return_storage_ptr__->_member).name._M_string_length = 0;
        (__return_storage_ptr__->_member).name.field_2._M_local_buf[0] = '\0';
        std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::~vector
                  ((vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *)local_e8);
        goto LAB_001057d3;
      }
      local_e8._0_8_ = ppcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"member","");
      if (local_a8._M_string_length < (ulong)local_e8._8_8_) {
        bVar8 = false;
      }
      else if ((pointer)local_e8._8_8_ == (pointer)0x0) {
        bVar8 = true;
      }
      else {
        puVar6 = (undefined1 *)0x0;
        do {
          bVar8 = *(char *)(local_e8._0_8_ + (long)puVar6) ==
                  local_a8._M_dataplus._M_p[(long)puVar6];
          if (!bVar8) break;
          bVar9 = (undefined1 *)((long)&(((pointer)(local_e8._8_8_ + -0x30))->_text).field_2 + 0xf)
                  != puVar6;
          puVar6 = puVar6 + 1;
        } while (bVar9);
      }
      if ((pointer *)local_e8._0_8_ != ppcVar1) {
        operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._M_allocated_capacity + 1));
      }
      if (bVar8) {
        parse_class_member((member_t *)local_e8,ctx,&local_a8);
        line_data_t::line_data_t(__return_storage_ptr__,(member_t *)local_e8);
        goto LAB_0010554d;
      }
      local_e8._0_8_ = ppcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"|","");
      if (local_a8._M_string_length < (ulong)local_e8._8_8_) {
        bVar8 = false;
      }
      else if ((pointer)local_e8._8_8_ == (pointer)0x0) {
        bVar8 = true;
      }
      else {
        puVar6 = (undefined1 *)0x0;
        do {
          bVar8 = *(char *)(local_e8._0_8_ + (long)puVar6) ==
                  local_a8._M_dataplus._M_p[(long)puVar6];
          if (!bVar8) break;
          bVar9 = (undefined1 *)((long)&(((pointer)(local_e8._8_8_ + -0x30))->_text).field_2 + 0xf)
                  != puVar6;
          puVar6 = puVar6 + 1;
        } while (bVar9);
      }
      if ((pointer *)local_e8._0_8_ != ppcVar1) {
        operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._M_allocated_capacity + 1));
      }
      if (!bVar8) goto LAB_001057c5;
      std::__cxx11::string::substr((ulong)local_e8,(ulong)line);
      parse_text_line(__return_storage_ptr__,ctx,(string *)local_e8);
    }
    local_58[0] = (pointer)local_d8._M_allocated_capacity;
    local_68 = (pointer *)local_e8._0_8_;
    if ((pointer *)local_e8._0_8_ == ppcVar1) goto LAB_001057d3;
  }
  else {
    if (cVar2 != '%') {
LAB_001057c5:
      parse_text_line(__return_storage_ptr__,ctx,line);
      goto LAB_001057d3;
    }
    local_e8._0_8_ = (pointer *)0x0;
    local_e8._8_8_ = local_e8._8_8_ & 0xffffffff00000000;
    std::__cxx11::string::substr((ulong)&local_68,(ulong)line);
    std::__cxx11::string::substr((ulong)&local_88,(ulong)line);
    pcVar7 = (pointer)0xf;
    if (local_68 != local_58) {
      pcVar7 = local_58[0];
    }
    if (pcVar7 < (pointer)(local_80 + local_60)) {
      pcVar7 = (pointer)0xf;
      if (local_88 != local_78) {
        pcVar7 = local_78[0];
      }
      if (pcVar7 < (pointer)(local_80 + local_60)) goto LAB_001052e7;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_68);
    }
    else {
LAB_001052e7:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88);
    }
    local_d8._M_allocated_capacity = (size_type)(local_e8 + 0x20);
    pcVar7 = (pointer)(puVar4 + 2);
    if ((pointer)*puVar4 == pcVar7) {
      local_c8._M_allocated_capacity = *(undefined8 *)pcVar7;
      local_c8._8_8_ = puVar4[3];
    }
    else {
      local_c8._M_allocated_capacity = *(undefined8 *)pcVar7;
      local_d8._M_allocated_capacity = (size_type)(pointer)*puVar4;
    }
    local_d8._8_8_ = puVar4[1];
    *puVar4 = pcVar7;
    puVar4[1] = 0;
    *pcVar7 = '\0';
    __l._M_len = 1;
    __l._M_array = (iterator)local_e8;
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::vector
              (&local_48,__l,&local_e9);
    __return_storage_ptr__->_type = cpp;
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::vector
              (&__return_storage_ptr__->_segments,&local_48);
    (__return_storage_ptr__->_class_data)._name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_class_data)._name.field_2;
    (__return_storage_ptr__->_class_data)._name._M_string_length = 0;
    (__return_storage_ptr__->_class_data)._name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_class_data)._parent_name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_class_data)._parent_name.field_2;
    (__return_storage_ptr__->_class_data)._parent_name._M_string_length = 0;
    (__return_storage_ptr__->_class_data)._parent_name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_member).class_name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_member).class_name.field_2;
    (__return_storage_ptr__->_member).class_name._M_string_length = 0;
    (__return_storage_ptr__->_member).class_name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_member).name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_member).name.field_2;
    (__return_storage_ptr__->_member).name._M_string_length = 0;
    (__return_storage_ptr__->_member).name.field_2._M_local_buf[0] = '\0';
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::~vector(&local_48);
    if ((undefined1 *)local_d8._M_allocated_capacity != local_e8 + 0x20) {
      operator_delete((void *)local_d8._M_allocated_capacity,local_c8._M_allocated_capacity + 1);
    }
    if (local_88 != local_78) {
      operator_delete(local_88,(ulong)(local_78[0] + 1));
    }
    if (local_68 == local_58) goto LAB_001057d3;
  }
  operator_delete(local_68,(ulong)(local_58[0] + 1));
LAB_001057d3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse_line(const parse_context& ctx) -> line_data_t
  {
    const auto pos_first_char = ctx._line.find_first_not_of(" \t");
    if (pos_first_char == ctx._line.npos)
    {
      if (ctx._class_curly_level and ctx._curly_level > ctx._class_curly_level)
      {
        return parse_text_line(ctx, ctx._line);
      }
      else
      {
        return line_data_t{};
      }
    }
    else
    {
      const auto rest = ctx._line.substr(pos_first_char + 1);
      switch (ctx._line.at(pos_first_char))
      {
      case '%':  // cpp line
        return line_data_t{line_type::cpp,
                           std::vector<segment_t>{{0,
                                                   segment_type::cpp,
                                                   ctx._line.substr(0, pos_first_char) +
                                                       ctx._line.substr(pos_first_char + 1)}}};
        break;
      case '$':  // opening / closing class or text line
        if (starts_with(rest, "class"))
        {
          return {parse_class(ctx, rest)};
        }
        else if (starts_with(rest, "endclass"))
        {
          return {line_type::class_end, {}};
        }
        else if (starts_with(rest, "member"))
        {
          return parse_class_member(ctx, rest);
        }
        else if (starts_with(rest, "|"))  // trim left
        {
          return parse_text_line(ctx, ctx._line.substr(pos_first_char + 2));
        }
        else
        {
          return parse_text_line(ctx, ctx._line);
        }
        break;
      default:
        return parse_text_line(ctx, ctx._line);
      }
    }
  }